

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::HandleSehExceptionsInMethodIfSupported<testing::internal::UnitTestImpl,bool>
               (UnitTestImpl *object,offset_in_UnitTestImpl_to_subr method,char *location)

{
  byte bVar1;
  code *local_50;
  char *location_local;
  offset_in_UnitTestImpl_to_subr method_local;
  UnitTestImpl *object_local;
  
  local_50 = (code *)method;
  if ((method & 1) != 0) {
    local_50 = *(code **)(*(long *)(location + (long)&object->_vptr_UnitTestImpl) + (method - 1));
  }
  bVar1 = (*local_50)(location + (long)&object->_vptr_UnitTestImpl);
  return (bool)(bVar1 & 1);
}

Assistant:

Result HandleSehExceptionsInMethodIfSupported(T* object, Result (T::*method)(),
                                              const char* location) {
#if GTEST_HAS_SEH
  __try {
    return (object->*method)();
  } __except (internal::UnitTestOptions::GTestShouldProcessSEH(  // NOLINT
      GetExceptionCode())) {
    // We create the exception message on the heap because VC++ prohibits
    // creation of objects with destructors on stack in functions using __try
    // (see error C2712).
    std::string* exception_message =
        FormatSehExceptionMessage(GetExceptionCode(), location);
    internal::ReportFailureInUnknownLocation(TestPartResult::kFatalFailure,
                                             *exception_message);
    delete exception_message;
    return static_cast<Result>(0);
  }
#else
  (void)location;
  return (object->*method)();
#endif  // GTEST_HAS_SEH
}